

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcc_uint.c
# Opt level: O3

qcc_generator_ptr qcc_gen_uint_in_range(qcc_context *ctx,size_t size,qcc_uint min,qcc_uint max)

{
  qcc_uint qVar1;
  qcc_generator_ptr pqVar2;
  qcc_generator_ptr pqVar3;
  qcc_generator_ptr pqVar4;
  qcc_generator_ptr pqVar5;
  qcc_generator_ptr pqVar6;
  qcc_generator_ptr pqVar7;
  qcc_generator_ptr pqVar8;
  ulong uVar9;
  
  qVar1 = qcc_uint_max(size);
  if (qVar1 < min) {
    min = qcc_uint_max(size);
  }
  qVar1 = qcc_uint_max(size);
  if (qVar1 < max) {
    max = qcc_uint_max(size);
  }
  if (min <= max) {
    if (max - min < 0x14) {
      pqVar2 = _gen_uint_in_range(ctx,size,min,max);
      return pqVar2;
    }
    uVar9 = max - min >> 1;
    pqVar2 = _gen_uint_in_range(ctx,size,min,min + 2);
    pqVar3 = _gen_uint_in_range(ctx,size,max - 2,max);
    pqVar4 = _gen_uint_in_range(ctx,size,(min + uVar9) - 1,min + uVar9 + 1);
    pqVar5 = _gen_uint_in_range(ctx,size,min,min + 10);
    pqVar6 = _gen_uint_in_range(ctx,size,max - 10,max);
    pqVar7 = _gen_uint_in_range(ctx,size,(min + uVar9) - 5,min + uVar9 + 5);
    pqVar8 = _gen_uint_in_range(ctx,size,min,max);
    pqVar2 = qcc_gen_one_of(ctx,pqVar2,pqVar3,pqVar4,pqVar5,pqVar6,pqVar7,pqVar8,0);
    return pqVar2;
  }
  __assert_fail("min <= max",
                "/workspace/llm4binary/github/license_all_cmakelists_25/skhoroshavin[P]qcc/src/qcc_uint.c"
                ,0x6f,
                "qcc_generator_ptr qcc_gen_uint_in_range(struct qcc_context *, size_t, qcc_uint, qcc_uint)"
               );
}

Assistant:

qcc_generator_ptr qcc_gen_uint_in_range(struct qcc_context *ctx, size_t size,
                                        qcc_uint min, qcc_uint max)
{
    min = _limit_uint(size, min);
    max = _limit_uint(size, max);
    assert(min <= max);

    if (max - min < 20) return _gen_uint_in_range(ctx, size, min, max);

    qcc_uint avg = min + (max - min) / 2;
    return qcc_gen_one_of(ctx, _gen_uint_in_range(ctx, size, min, min + 2),
                          _gen_uint_in_range(ctx, size, max - 2, max),
                          _gen_uint_in_range(ctx, size, avg - 1, avg + 1),
                          _gen_uint_in_range(ctx, size, min, min + 10),
                          _gen_uint_in_range(ctx, size, max - 10, max),
                          _gen_uint_in_range(ctx, size, avg - 5, avg + 5),
                          _gen_uint_in_range(ctx, size, min, max), (void *)0);
}